

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::cmInstallExportGenerator
          (cmInstallExportGenerator *this,cmExportSet *exportSet,string *destination,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,
          string filename,string name_space,string cxx_modules_directory,bool exportOld,bool android
          ,bool exportPackageDependencies,cmListFileBacktrace backtrace)

{
  cmExportInstallFileGenerator *pcVar1;
  _Head_base<0UL,_cmExportInstallFileGenerator_*,_false> _Var2;
  _Head_base<0UL,_cmExportInstallFileGenerator_*,_false> local_a8;
  string *local_a0;
  string *local_98;
  cmInstallExportGenerator *local_90;
  cmListFileBacktrace local_88;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)destination);
  std::__cxx11::string::string((string *)&local_70,(string *)component);
  local_88.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)name_space.field_2._M_allocated_capacity;
  local_88.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        (name_space.field_2._M_allocated_capacity + 8);
  *(undefined8 *)(name_space.field_2._M_allocated_capacity + 8) = 0;
  *(undefined8 *)name_space.field_2._M_allocated_capacity = 0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_50,configurations,&local_70,message,
             exclude_from_all,false,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_00a17d10;
  this->ExportSet = exportSet;
  local_98 = &this->FilePermissions;
  std::__cxx11::string::string((string *)local_98,(string *)file_permissions);
  local_a0 = &this->FileName;
  std::__cxx11::string::string((string *)local_a0,(string *)filename._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&this->Namespace,(string *)filename._M_string_length);
  std::__cxx11::string::string
            ((string *)&this->CxxModulesDirectory,(string *)filename.field_2._M_allocated_capacity);
  this->ExportOld = (bool)filename.field_2._M_local_buf[8];
  this->ExportPackageDependencies = name_space._M_string_length._0_1_;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  (this->TempDir)._M_dataplus._M_p = (pointer)&(this->TempDir).field_2;
  (this->TempDir)._M_string_length = 0;
  (this->TempDir).field_2._M_local_buf[0] = '\0';
  (this->MainImportFile)._M_dataplus._M_p = (pointer)&(this->MainImportFile).field_2;
  (this->MainImportFile)._M_string_length = 0;
  (this->MainImportFile).field_2._M_local_buf[0] = '\0';
  (this->EFGen)._M_t.
  super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
  .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl =
       (cmExportInstallFileGenerator *)0x0;
  local_90 = this;
  if ((char)name_space._M_dataplus._M_p == '\0') {
    std::make_unique<cmExportInstallFileGenerator,cmInstallExportGenerator*>
              ((cmInstallExportGenerator **)&local_a8);
  }
  else {
    std::make_unique<cmExportInstallAndroidMKGenerator,cmInstallExportGenerator*>
              ((cmInstallExportGenerator **)&local_a8);
  }
  _Var2._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl = (cmExportInstallFileGenerator *)0x0;
  pcVar1 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  (this->EFGen)._M_t.
  super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
  .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pcVar1 != (cmExportInstallFileGenerator *)0x0) {
    (**(code **)((long)(pcVar1->super_cmExportFileGenerator)._vptr_cmExportFileGenerator + 8))();
    if (local_a8._M_head_impl != (cmExportInstallFileGenerator *)0x0) {
      (*((local_a8._M_head_impl)->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[1])();
    }
  }
  cmExportSet::AddInstallation(exportSet,this);
  return;
}

Assistant:

cmInstallExportGenerator::cmInstallExportGenerator(
  cmExportSet* exportSet, std::string const& destination,
  std::string file_permissions, std::vector<std::string> const& configurations,
  std::string const& component, MessageLevel message, bool exclude_from_all,
  std::string filename, std::string name_space,
  std::string cxx_modules_directory, bool exportOld, bool android,
  bool exportPackageDependencies, cmListFileBacktrace backtrace)
  : cmInstallGenerator(destination, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , ExportSet(exportSet)
  , FilePermissions(std::move(file_permissions))
  , FileName(std::move(filename))
  , Namespace(std::move(name_space))
  , CxxModulesDirectory(std::move(cxx_modules_directory))
  , ExportOld(exportOld)
  , ExportPackageDependencies(exportPackageDependencies)
{
  if (android) {
#ifndef CMAKE_BOOTSTRAP
    this->EFGen = cm::make_unique<cmExportInstallAndroidMKGenerator>(this);
#endif
  } else {
    this->EFGen = cm::make_unique<cmExportInstallFileGenerator>(this);
  }
  exportSet->AddInstallation(this);
}